

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_codec_to_id(cram_codec *c,int *id2)

{
  int local_20;
  int local_1c;
  int bnum2;
  int bnum1;
  int *id2_local;
  cram_codec *c_local;
  
  local_20 = -2;
  switch(c->codec) {
  case E_NULL:
    local_1c = -2;
    break;
  case E_EXTERNAL:
    local_1c = (c->field_6).huffman.ncodes;
    break;
  case E_GOLOMB:
  case E_BETA:
  case E_SUBEXP:
  case E_GOLOMB_RICE:
  case E_GAMMA:
    local_1c = -1;
    break;
  case E_HUFFMAN:
    local_1c = -1;
    if ((c->field_6).huffman.ncodes == 1) {
      local_1c = -2;
    }
    break;
  case E_BYTE_ARRAY_LEN:
    local_1c = cram_codec_to_id((c->field_6).byte_array_len.len_codec,(int *)0x0);
    local_20 = cram_codec_to_id((c->field_6).byte_array_len.value_codec,(int *)0x0);
    break;
  case E_BYTE_ARRAY_STOP:
    local_1c = (c->field_6).beta.nbits;
    break;
  default:
    fprintf(_stderr,"Unknown codec type %d\n",(ulong)c->codec);
    local_1c = -1;
  }
  if (id2 != (int *)0x0) {
    *id2 = local_20;
  }
  return local_1c;
}

Assistant:

int cram_codec_to_id(cram_codec *c, int *id2) {
    int bnum1, bnum2 = -2;

    switch (c->codec) {
    case E_HUFFMAN:
	bnum1 = c->huffman.ncodes == 1 ? -2 : -1;
	break;
    case E_GOLOMB:
    case E_BETA:
    case E_SUBEXP:
    case E_GOLOMB_RICE:
    case E_GAMMA:
	bnum1 = -1;
	break;
    case E_EXTERNAL:
	bnum1 = c->external.content_id;
	break;
    case E_BYTE_ARRAY_LEN:
	bnum1 = cram_codec_to_id(c->byte_array_len.len_codec, NULL);
	bnum2 = cram_codec_to_id(c->byte_array_len.value_codec, NULL);
	break;
    case E_BYTE_ARRAY_STOP:
	bnum1 = c->byte_array_stop.content_id;
	break;
    case E_NULL:
	bnum1 = -2;
	break;
    default:
	fprintf(stderr, "Unknown codec type %d\n", c->codec);
	bnum1 = -1;
    }

    if (id2)
	*id2 = bnum2;
    return bnum1;
}